

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_ManVectorAffinity(Gia_Man_t *p,Vec_Int_t *vSuper,Vec_Int_t *vDelay,word *Matrix,int nLimit)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  int Levels [256];
  uint local_458;
  int aiStack_438 [258];
  
  uVar2 = vSuper->nSize;
  if ((int)uVar2 < 3) {
    __assert_fail("nSize > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x366,
                  "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)");
  }
  if ((int)uVar2 < 0x41) {
    Gia_ManIncrementTravId(p);
    if (0 < vSuper->nSize) {
      piVar4 = vSuper->pArray;
      lVar9 = 0;
      do {
        if (piVar4[lVar9] < 0) goto LAB_007da639;
        uVar11 = (uint)piVar4[lVar9] >> 1;
        if (p->nTravIdsAlloc <= (int)uVar11) {
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
        }
        p->pTravIds[uVar11] = p->nTravIds;
        if ((p->vCopies).nSize <= (int)uVar11) goto LAB_007da5fb;
        (p->vCopies).pArray[uVar11] = (int)lVar9;
        Matrix[lVar9] = 0x8000000000000000 >> ((byte)lVar9 & 0x3f);
        aiStack_438[lVar9] = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < vSuper->nSize);
    }
    if (0 < vSuper->nSize) {
      iVar12 = 1;
      uVar10 = 0;
      local_458 = uVar2;
      do {
        if (vSuper->pArray[uVar10] < 0) {
LAB_007da639:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar11 = (uint)vSuper->pArray[uVar10] >> 1;
        if (p->nObjs <= (int)uVar11) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar1 = p->pObjs + uVar11;
        if ((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) {
          iVar14 = 1;
          do {
            pGVar5 = p->pObjs;
            if (iVar14 == 1) {
              if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) goto LAB_007da5bd;
              uVar11 = (uint)*(undefined8 *)pGVar1;
            }
            else {
              if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) goto LAB_007da5bd;
              uVar11 = *(uint *)&pGVar1->field_0x4;
            }
            uVar11 = (int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2) * -0x55555555 -
                     (uVar11 & 0x1fffffff);
            if (p->nTravIdsAlloc <= (int)uVar11) goto LAB_007da61a;
            if (p->pTravIds[(int)uVar11] != p->nTravIds) {
              if (vSuper->nSize == nLimit) break;
              p->pTravIds[(int)uVar11] = p->nTravIds;
              iVar3 = vSuper->nSize;
              Matrix[iVar3] = 0;
              aiStack_438[iVar3] = iVar12;
              if (((int)uVar11 < 0) || ((p->vCopies).nSize <= (int)uVar11)) goto LAB_007da5fb;
              (p->vCopies).pArray[uVar11] = iVar3;
              Vec_IntPush(vSuper,uVar11 * 2);
            }
            if (((int)uVar11 < 0) || ((p->vCopies).nSize <= (int)uVar11)) goto LAB_007da5dc;
            Matrix[(p->vCopies).pArray[uVar11]] =
                 Matrix[(p->vCopies).pArray[uVar11]] | Matrix[uVar10];
            iVar14 = iVar14 + -1;
          } while (iVar14 == 0);
        }
        pGVar5 = p->pObjs;
        if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) {
LAB_007da5bd:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        puVar6 = p->pMuxes;
        if ((puVar6 == (uint *)0x0) ||
           (iVar14 = (int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2),
           puVar6[iVar14 * -0x55555555] == 0)) {
LAB_007da456:
          if (uVar10 == local_458) {
            local_458 = vSuper->nSize;
            iVar12 = iVar12 + 1;
          }
          bVar15 = iVar12 != 8;
        }
        else {
          uVar11 = 0xffffffff;
          if (puVar6 != (uint *)0x0) {
            uVar8 = puVar6[iVar14 * -0x55555555];
            if (uVar8 != 0) {
              if ((int)uVar8 < 0) goto LAB_007da639;
              uVar11 = uVar8 >> 1;
            }
          }
          if (p->nTravIdsAlloc <= (int)uVar11) {
LAB_007da61a:
            __assert_fail("Id < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
          }
          if (p->pTravIds[(int)uVar11] == p->nTravIds) {
LAB_007da42a:
            if (((int)uVar11 < 0) || ((p->vCopies).nSize <= (int)uVar11)) {
LAB_007da5dc:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Matrix[(p->vCopies).pArray[uVar11]] =
                 Matrix[(p->vCopies).pArray[uVar11]] | Matrix[uVar10];
            goto LAB_007da456;
          }
          if (vSuper->nSize != nLimit) {
            p->pTravIds[(int)uVar11] = p->nTravIds;
            iVar14 = vSuper->nSize;
            Matrix[iVar14] = 0;
            aiStack_438[iVar14] = iVar12;
            if (((int)uVar11 < 0) || ((p->vCopies).nSize <= (int)uVar11)) {
LAB_007da5fb:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p->vCopies).pArray[uVar11] = iVar14;
            Vec_IntPush(vSuper,uVar11 * 2);
            goto LAB_007da42a;
          }
          bVar15 = false;
        }
      } while ((bVar15) && (uVar10 = uVar10 + 1, (long)uVar10 < (long)vSuper->nSize));
    }
    iVar12 = vSuper->nSize;
    if ((long)iVar12 < 1) {
      iVar14 = 0;
    }
    else {
      lVar9 = 0;
      iVar14 = 0;
      do {
        uVar10 = Matrix[lVar9];
        if (uVar10 == 0) {
          __assert_fail("Matrix[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x3a5,
                        "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)"
                       );
        }
        if (((uVar10 & uVar10 - 1) != 0) && (uVar10 != -1L << (-(char)uVar2 & 0x3fU))) {
          Matrix[iVar14] = uVar10;
          aiStack_438[iVar14] = aiStack_438[lVar9];
          iVar14 = iVar14 + 1;
          if (iVar14 == 0x40) {
            iVar14 = 0x40;
            break;
          }
        }
        lVar9 = lVar9 + 1;
      } while (iVar12 != lVar9);
    }
    if (iVar14 < 0x40) {
      memset(Matrix + iVar14,0,(ulong)(0x3f - iVar14) * 8 + 8);
    }
    if (iVar14 == 0) {
      if (iVar12 < (int)uVar2) goto LAB_007da6d4;
      vSuper->nSize = uVar2;
      iVar14 = 0;
    }
    else {
      uVar10 = 0xffffffff;
      uVar11 = 0x20;
      do {
        uVar8 = 0;
        do {
          uVar7 = Matrix[(int)(uVar8 + uVar11)];
          uVar13 = (uVar7 >> (sbyte)uVar11 ^ Matrix[(int)uVar8]) & uVar10;
          Matrix[(int)uVar8] = Matrix[(int)uVar8] ^ uVar13;
          Matrix[(int)(uVar8 + uVar11)] = uVar13 << (sbyte)uVar11 ^ uVar7;
          uVar8 = uVar8 + uVar11 + 1 & ~uVar11;
        } while ((int)uVar8 < 0x40);
        uVar10 = uVar10 ^ uVar10 << (sbyte)(uVar11 >> 1);
        bVar15 = 1 < uVar11;
        uVar11 = uVar11 >> 1;
      } while (bVar15);
      if (iVar12 < (int)uVar2) {
LAB_007da6d4:
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vSuper->nSize = uVar2;
    }
  }
  else {
    iVar14 = 0;
    memset(Matrix,0,0x200);
  }
  return iVar14;
}

Assistant:

int Str_ManVectorAffinity( Gia_Man_t * p, Vec_Int_t * vSuper, Vec_Int_t * vDelay, word Matrix[256], int nLimit )
{
    int fVerbose = 0;
    int Levels[256];
    int nSize = Vec_IntSize(vSuper);
    int Prev = nSize, nLevels = 1;
    int i, k, iLit, iFanin, nSizeNew;
    word Mask; 
    assert( nSize > 2 );
    if ( nSize > 64 )
    {
        for ( i = 0; i < 64; i++ )
            Matrix[i] = 0;
        return 0;
    }
    // mark current nodes
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_ObjSetTravIdCurrentId( p, Abc_Lit2Var(iLit) );
        Str_ManSetNum( p, Abc_Lit2Var(iLit), i );
        Matrix[i] = ((word)1) << (63-i);
        Levels[i] = 0;
    }
    // collect 64 nodes
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            for ( k = 0; k < 2; k++ )
            {
                iFanin = k ? Gia_ObjFaninId1p(p, pObj) : Gia_ObjFaninId0p(p, pObj);
                if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
                {
                    if ( Vec_IntSize(vSuper) == nLimit )
                        break;
                    Gia_ObjSetTravIdCurrentId( p, iFanin );
                    Matrix[Vec_IntSize(vSuper)] = 0;
                    Levels[Vec_IntSize(vSuper)] = nLevels;
                    Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                    Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
                }
                Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
            }
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {
            iFanin = Gia_ObjFaninId2p(p, pObj);
            if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
            {
                if ( Vec_IntSize(vSuper) == nLimit )
                    break;
                Gia_ObjSetTravIdCurrentId( p, iFanin );
                Matrix[Vec_IntSize(vSuper)] = 0;
                Levels[Vec_IntSize(vSuper)] = nLevels;
                Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
            }
            Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
        }
        if ( Prev == i )
            Prev = Vec_IntSize(vSuper), nLevels++;
        if ( nLevels == 8 )
            break;
    }

    // remove those that have all 1s or only one 1
    Mask = (~(word)0) << (64 - nSize);
    for ( k = i = 0; i < Vec_IntSize(vSuper); i++ )
    {
        assert( Matrix[i] );
        if ( (Matrix[i] & (Matrix[i] - 1)) == 0 )
            continue;
        if ( Matrix[i] == Mask )
            continue;
        Matrix[k] = Matrix[i];
        Levels[k] = Levels[i];
        k++;
        if ( k == 64 )
            break;
    }
    // clean the remaining ones
    for ( i = k; i < 64; i++ )
        Matrix[i] = 0;
    nSizeNew = k;
    if ( nSizeNew == 0 )
    {
        Vec_IntShrink( vSuper, nSize );
        return 0;
    }
/*
    // report
    if ( fVerbose && nSize > 20 )
    {
        for ( i = 0; i < nSizeNew; i++ )
            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        printf( "\n" );
    }
*/
    transpose64( Matrix );

    // report
    if ( fVerbose && nSize > 10 )
    {
        printf( "Gate inputs = %d.  Collected fanins = %d.  All = %d.  Good = %d.  Levels = %d\n", 
            nSize, Vec_IntSize(vSuper) - nSize, Vec_IntSize(vSuper), nSizeNew, nLevels );
        printf( "                     " );
        for ( i = 0; i < nSizeNew; i++ )
            printf( "%d", Levels[i] );
        printf( "\n" );
        for ( i = 0; i < nSize; i++ )
        {
            printf( "%6d : ", Abc_Lit2Var(Vec_IntEntry(vSuper, i)) );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) >> 4 );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) & 15 );
//            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        }
        i = 0;
    }
    Vec_IntShrink( vSuper, nSize );
    return nSizeNew;
}